

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O0

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_values
          (mbedtls_cipher_id_t cipher_id,int key_bitlen,mbedtls_cipher_mode_t mode)

{
  mbedtls_cipher_base_t *pmVar1;
  size_t sVar2;
  uint in_EDX;
  uint in_ESI;
  mbedtls_cipher_id_t in_EDI;
  mbedtls_cipher_definition_t *def;
  mbedtls_cipher_definition_t *local_20;
  
  local_20 = mbedtls_cipher_definitions;
  while( true ) {
    if (local_20->info == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    pmVar1 = mbedtls_cipher_get_base(local_20->info);
    if (((pmVar1->cipher == in_EDI) &&
        (sVar2 = mbedtls_cipher_info_get_key_bitlen(local_20->info), sVar2 == in_ESI)) &&
       ((*(uint *)&local_20->info->field_0x8 >> 0xc & 0xf) == in_EDX)) break;
    local_20 = local_20 + 1;
  }
  return local_20->info;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_values(
    const mbedtls_cipher_id_t cipher_id,
    int key_bitlen,
    const mbedtls_cipher_mode_t mode)
{
    const mbedtls_cipher_definition_t *def;

    for (def = mbedtls_cipher_definitions; def->info != NULL; def++) {
        if (mbedtls_cipher_get_base(def->info)->cipher == cipher_id &&
            mbedtls_cipher_info_get_key_bitlen(def->info) == (unsigned) key_bitlen &&
            def->info->mode == mode) {
            return def->info;
        }
    }

    return NULL;
}